

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytraced_renderer.cpp
# Opt level: O1

void __thiscall
CGL::RaytracedRenderer::save_sampling_rate_image(RaytracedRenderer *this,string *filename)

{
  size_t w;
  size_t h;
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  float fVar4;
  size_t y;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  uchar *in;
  long *plVar8;
  size_type *psVar9;
  ulong uVar10;
  long lVar11;
  size_t x;
  float fVar12;
  ImageBuffer outputBuffer;
  string local_b0;
  string *local_90;
  size_t local_88;
  long local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  ImageBuffer local_58;
  
  w = (this->frameBuffer).w;
  h = (this->frameBuffer).h;
  local_90 = filename;
  ImageBuffer::ImageBuffer(&local_58,w,h);
  if (w != 0) {
    local_88 = h - 1;
    lVar11 = 0;
    x = 0;
    lVar6 = lVar11;
    sVar7 = local_88;
    sVar5 = h;
    do {
      while (y = sVar7, local_80 = lVar6, sVar5 != 0) {
        fVar12 = (float)*(int *)(*(long *)(this->pt + 0xd8) + lVar11) /
                 (float)*(ulong *)(this->pt + 0x40);
        if (fVar12 <= 0.5) {
          fVar4 = (0.5 - fVar12) + (0.5 - fVar12);
          fVar12 = (1.0 - fVar4) * 0.0;
          fVar1 = fVar4 * 0.0 + fVar12;
          fVar2 = fVar4 * 0.0 + (1.0 - fVar4);
          fVar12 = fVar12 + fVar4;
        }
        else {
          fVar4 = (1.0 - fVar12) + (1.0 - fVar12);
          fVar12 = (1.0 - fVar4) * 0.0;
          fVar1 = fVar4 * 0.0 + (1.0 - fVar4);
          fVar2 = fVar12 + fVar4;
          fVar12 = fVar4 * 0.0 + fVar12;
        }
        auVar3 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2),0x10);
        local_b0._M_dataplus._M_p = (pointer)vmovlps_avx(auVar3);
        local_b0._M_string_length = CONCAT44((int)(local_b0._M_string_length >> 0x20),fVar12);
        ImageBuffer::update_pixel(&local_58,(Color *)&local_b0,x,y);
        lVar11 = lVar11 + w * 4;
        lVar6 = local_80;
        sVar7 = y - 1;
        sVar5 = y;
      }
      x = x + 1;
      lVar11 = local_80 + 4;
      lVar6 = lVar11;
      sVar7 = local_88;
      sVar5 = h;
    } while (x != w);
  }
  uVar10 = h * w;
  in = (uchar *)operator_new__(-(ulong)(uVar10 >> 0x3e != 0) | uVar10 * 4);
  if (uVar10 != 0) {
    lVar11 = 0;
    do {
      *(uint *)(in + lVar11 * 4) =
           local_58.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar11] | 0xff000000;
      lVar11 = lVar11 + 1;
    } while (uVar10 - lVar11 != 0);
  }
  std::__cxx11::string::substr((ulong)local_78,(ulong)local_90);
  plVar8 = (long *)std::__cxx11::string::append((char *)local_78);
  psVar9 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_b0.field_2._M_allocated_capacity = *psVar9;
    local_b0.field_2._8_8_ = plVar8[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar9;
    local_b0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_b0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  lodepng::encode(&local_b0,in,(uint)w,(uint)h,LCT_RGBA,8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  operator_delete__(in);
  if (local_58.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void RaytracedRenderer::save_sampling_rate_image(string filename) {
  size_t w = frameBuffer.w;
  size_t h = frameBuffer.h;
  ImageBuffer outputBuffer(w, h);

  for (int x = 0; x < w; x++) {
      for (int y = 0; y < h; y++) {
          float samplingRate = pt->sampleCountBuffer[y * w + x] * 1.0f / pt->ns_aa;

          Color c;
          if (samplingRate <= 0.5) {
              float r = (0.5 - samplingRate) / 0.5;
              c = Color(0.0f, 0.0f, 1.0f) * r + Color(0.0f, 1.0f, 0.0f) * (1.0 - r);
          } else {
              float r = (1.0 - samplingRate) / 0.5;
              c = Color(0.0f, 1.0f, 0.0f) * r + Color(1.0f, 0.0f, 0.0f) * (1.0 - r);
          }
          outputBuffer.update_pixel(c, x, h - 1 - y);
      }
  }
  uint32_t* frame_out = new uint32_t[w * h];
  
  for (size_t i = 0; i < w * h; ++i) {
    uint32_t out_color_hex = 0;
    frame_out[i] = outputBuffer.data.data()[i];
    frame_out[i] |= 0xFF000000;
  }

  lodepng::encode(filename.substr(0,filename.size()-4) + "_rate.png", (unsigned char*) frame_out, w, h);
  
  delete[] frame_out;
}